

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O0

filepos_t __thiscall
libebml::EbmlElement::Render
          (EbmlElement *this,IOCallback *output,bool bWithDefault,bool bKeepPosition,
          bool bForceRender)

{
  uint uVar1;
  int iVar2;
  filepos_t fVar3;
  undefined4 extraout_var;
  bool local_49;
  bool local_39;
  uint64 WrittenSize;
  filepos_t result;
  bool bForceRender_local;
  bool bKeepPosition_local;
  bool bWithDefault_local;
  IOCallback *output_local;
  EbmlElement *this_local;
  
  local_39 = true;
  if ((this->bValueIsSet & 1U) == 0) {
    local_49 = false;
    if (bWithDefault) {
      local_49 = DefaultISset(this);
    }
    local_39 = local_49;
  }
  if (local_39 != false) {
    if ((bWithDefault) || (uVar1 = (*this->_vptr_EbmlElement[0xf])(), (uVar1 & 1) == 0)) {
      fVar3 = RenderHead(this,output,bForceRender,bWithDefault,bKeepPosition);
      iVar2 = (*this->_vptr_EbmlElement[0x11])(this,output,(ulong)bForceRender,(ulong)bWithDefault);
      this_local = (EbmlElement *)(CONCAT44(extraout_var,iVar2) + fVar3);
    }
    else {
      this_local = (EbmlElement *)0x0;
    }
    return (filepos_t)this_local;
  }
  __assert_fail("bValueIsSet || (bWithDefault && DefaultISset())",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlElement.cpp"
                ,0x259,"filepos_t libebml::EbmlElement::Render(IOCallback &, bool, bool, bool)");
}

Assistant:

filepos_t EbmlElement::Render(IOCallback & output, bool bWithDefault, bool bKeepPosition, bool bForceRender)
{
  assert(bValueIsSet || (bWithDefault && DefaultISset())); // an element is been rendered without a value set !!!
  // it may be a mandatory element without a default value
  if (!bWithDefault && IsDefaultValue()) {
    return 0;
  }
#if defined(LIBEBML_DEBUG)
  uint64 SupposedSize = UpdateSize(bWithDefault, bForceRender);
#endif // LIBEBML_DEBUG
  filepos_t result = RenderHead(output, bForceRender, bWithDefault, bKeepPosition);
  uint64 WrittenSize = RenderData(output, bForceRender, bWithDefault);
#if defined(LIBEBML_DEBUG)
  if (static_cast<int64>(SupposedSize) != (0-1))
    assert(WrittenSize == SupposedSize);
#endif // LIBEBML_DEBUG
  result += WrittenSize;
  return result;
}